

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QByteArray>>(QDataStream *s,QList<QByteArray> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff58;
  QDataStream *in_stack_ffffffffffffff60;
  QByteArray *ba;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  QList<QByteArray> *in_stack_ffffffffffffffa8;
  undefined1 *asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  asize = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  QList<QByteArray>::clear((QList<QByteArray> *)in_stack_ffffffffffffff60);
  qVar3 = QDataStream::readQSizeType(in_stack_ffffffffffffff60);
  if (qVar3 < 0) {
    QDataStream::setStatus(in_RDI,SizeLimitExceeded);
  }
  else {
    QList<QByteArray>::reserve(in_stack_ffffffffffffffa8,(qsizetype)asize);
    for (ba = (QByteArray *)0x0; (long)ba < qVar3; ba = (QByteArray *)((long)&(ba->d).d + 1)) {
      QByteArray::QByteArray((QByteArray *)0x3e2b62);
      ::operator>>((QDataStream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),ba);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QList<QByteArray>::append
                  ((QList<QByteArray> *)in_stack_ffffffffffffff60,
                   (parameter_type)in_stack_ffffffffffffff58);
        iVar4 = 0;
      }
      else {
        QList<QByteArray>::clear((QList<QByteArray> *)in_stack_ffffffffffffff60);
        iVar4 = 2;
      }
      QByteArray::~QByteArray((QByteArray *)0x3e2be6);
      if (iVar4 != 0) break;
      in_stack_ffffffffffffff8c = 0;
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}